

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_8,_8>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  Matrix<float,_2,_3> *pMVar5;
  float *b;
  Matrix<float,_2,_3> *pMVar6;
  long lVar7;
  bool bVar8;
  undefined4 uVar9;
  Type in1;
  Type in0;
  undefined8 uStack_90;
  float local_84 [3];
  Matrix<float,_2,_3> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40 [6];
  Matrix<float,_2,_3> local_28;
  
  puVar1 = &local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar9 = 0;
        }
        *(undefined4 *)(puVar1 + lVar7) = uVar9;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
    local_58 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_50 = *(undefined8 *)evalCtx->in[1].m_data;
    local_48 = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    puVar4 = &s_constInMat3x2;
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        *(undefined4 *)(puVar1 + lVar7) = puVar4[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 3;
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
  }
  pfVar2 = (float *)&local_78;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pMVar5 = (Matrix<float,_2,_3> *)0x0;
    do {
      pMVar6 = (Matrix<float,_2,_3> *)0x0;
      do {
        uVar9 = 0x3f800000;
        if (pMVar5 != pMVar6) {
          uVar9 = 0;
        }
        pfVar2[(long)pMVar6 * 2] = (float)uVar9;
        pMVar6 = (Matrix<float,_2,_3> *)((long)(pMVar6->m_data).m_data[0].m_data + 1);
      } while (pMVar6 != (Matrix<float,_2,_3> *)0x3);
      b = (float *)((long)(pMVar5->m_data).m_data[0].m_data + 1);
      pfVar2 = pfVar2 + 1;
      bVar8 = pMVar5 == (Matrix<float,_2,_3> *)0x0;
      pMVar5 = (Matrix<float,_2,_3> *)b;
    } while (bVar8);
    local_78.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_78.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_78.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    b = (float *)&DAT_01c37838;
    lVar3 = 0;
    do {
      lVar7 = 0;
      do {
        pfVar2[lVar7 * 2] = (((Matrix<float,_2,_3> *)b)->m_data).m_data[0].m_data[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      pfVar2 = pfVar2 + 1;
      b = (((Matrix<float,_2,_3> *)b)->m_data).m_data[1].m_data + 1;
      bVar8 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar8);
  }
  uStack_90 = 0x10c018d;
  matrixCompMult<float,2,3>
            (&local_28,(MatrixCaseUtils *)&local_58,&local_78,(Matrix<float,_2,_3> *)b);
  local_84[0] = local_28.m_data.m_data[0].m_data[0] + local_28.m_data.m_data[0].m_data[1];
  local_84[1] = local_28.m_data.m_data[1].m_data[0] + local_28.m_data.m_data[1].m_data[1];
  local_84[2] = local_28.m_data.m_data[2].m_data[0] + local_28.m_data.m_data[2].m_data[1];
  local_40[2] = 0;
  local_40[3] = 1;
  local_40[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_40[lVar3]] = *(float *)((long)&uStack_90 + lVar3 * 4 + 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}